

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-gram.c
# Opt level: O2

void yyStackOverflow(yyParser *yypParser)

{
  yyStackEntry *pyVar1;
  
  pyVar1 = yypParser->yytos;
  while (yypParser->yystack < pyVar1) {
    pyVar1 = pyVar1 + -1;
    yypParser->yytos = pyVar1;
  }
  builtin_strncpy(yypParser->info->errbuf,"parser stack overflow",0x16);
  yypParser->info = yypParser->info;
  return;
}

Assistant:

static void yyStackOverflow(yyParser *yypParser){
   ztparseARG_FETCH
   ztparseCTX_FETCH
#ifndef NDEBUG
   if( yyTraceFILE ){
     fprintf(yyTraceFILE,"%sStack Overflow!\n",yyTracePrompt);
   }
#endif
   while( yypParser->yytos>yypParser->yystack ) yy_pop_parser_stack(yypParser);
   /* Here code is inserted which will execute if the parser
   ** stack every overflows */
/******** Begin %stack_overflow code ******************************************/
#line 25 "/workspace/llm4binary/github/license_c_cmakelists/dpt[P]The-Great-Escape-in-C/build_O2/zerotape-prefix/src/zerotape/libraries/zerotape/zt-gram.y"

  sprintf(info->errbuf, "parser stack overflow");
#line 804 "/workspace/llm4binary/github/license_c_cmakelists/dpt[P]The-Great-Escape-in-C/build_O2/zerotape-prefix/src/zerotape-build/libraries/zerotape/zt-gram.c"
/******** End %stack_overflow code ********************************************/
   ztparseARG_STORE /* Suppress warning about unused %extra_argument var */
   ztparseCTX_STORE
}